

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elasticConstantsCmd.cpp
# Opt level: O1

int update_arg(void *field,char **orig_field,uint *field_given,uint *prev_given,char *value,
              char **possible_values,char *default_value,cmdline_parser_arg_type arg_type,
              int check_ambiguity,int override,int no_free,int multiple_option,char *long_opt,
              char short_opt,char *additional_error)

{
  int iVar1;
  char *pcVar2;
  undefined4 in_stack_00000034;
  
  if ((prev_given == (uint *)0x0) ||
     ((*prev_given == 0 && ((check_ambiguity == 0 || (*field_given == 0)))))) {
    if (possible_values != (char **)0x0) {
      if (value != (char *)0x0) {
        default_value = value;
      }
      iVar1 = check_possible_values(default_value,possible_values);
      if (iVar1 < 0) {
        pcVar2 = "invalid";
        if (iVar1 == -2) {
          pcVar2 = "ambiguous";
        }
        fprintf(_stderr,"%s: %s argument, \"%s\", for option `--%s\' (`-%c\')%s\n",package_name,
                pcVar2,value,CONCAT44(in_stack_00000034,multiple_option),(ulong)long_opt & 0xff,"");
        goto LAB_00131376;
      }
    }
    if (((field_given == (uint *)0x0) || (override != 0)) || (iVar1 = 0, *field_given == 0)) {
      if (prev_given != (uint *)0x0) {
        *prev_given = *prev_given + 1;
      }
      if (field_given != (uint *)0x0) {
        *field_given = *field_given + 1;
      }
      iVar1 = (*(code *)(&DAT_00299dd4 + *(int *)(&DAT_00299dd4 + (ulong)(arg_type - ARG_FLAG) * 4))
              )();
      return iVar1;
    }
  }
  else {
    fprintf(_stderr,"%s: `--%s\' (`-%c\') option given more than once%s\n",package_name,
            CONCAT44(in_stack_00000034,multiple_option),(ulong)long_opt & 0xff,"");
LAB_00131376:
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static
int update_arg(void *field, char **orig_field,
               unsigned int *field_given, unsigned int *prev_given, 
               char *value, const char *possible_values[],
               const char *default_value,
               cmdline_parser_arg_type arg_type,
               int check_ambiguity, int override,
               int no_free, int multiple_option,
               const char *long_opt, char short_opt,
               const char *additional_error)
{
  char *stop_char = 0;
  const char *val = value;
  int found;
  char **string_field;
  FIX_UNUSED (field);

  stop_char = 0;
  found = 0;

  if (!multiple_option && prev_given && (*prev_given || (check_ambiguity && *field_given)))
    {
      if (short_opt != '-')
        fprintf (stderr, "%s: `--%s' (`-%c') option given more than once%s\n", 
               package_name, long_opt, short_opt,
               (additional_error ? additional_error : ""));
      else
        fprintf (stderr, "%s: `--%s' option given more than once%s\n", 
               package_name, long_opt,
               (additional_error ? additional_error : ""));
      return 1; /* failure */
    }

  if (possible_values && (found = check_possible_values((value ? value : default_value), possible_values)) < 0)
    {
      if (short_opt != '-')
        fprintf (stderr, "%s: %s argument, \"%s\", for option `--%s' (`-%c')%s\n", 
          package_name, (found == -2) ? "ambiguous" : "invalid", value, long_opt, short_opt,
          (additional_error ? additional_error : ""));
      else
        fprintf (stderr, "%s: %s argument, \"%s\", for option `--%s'%s\n", 
          package_name, (found == -2) ? "ambiguous" : "invalid", value, long_opt,
          (additional_error ? additional_error : ""));
      return 1; /* failure */
    }
    
  if (field_given && *field_given && ! override)
    return 0;
  if (prev_given)
    (*prev_given)++;
  if (field_given)
    (*field_given)++;
  if (possible_values)
    val = possible_values[found];

  switch(arg_type) {
  case ARG_FLAG:
    *((int *)field) = !*((int *)field);
    break;
  case ARG_INT:
    if (val) *((int *)field) = strtol (val, &stop_char, 0);
    break;
  case ARG_DOUBLE:
    if (val) *((double *)field) = strtod (val, &stop_char);
    break;
  case ARG_STRING:
    if (val) {
      string_field = (char **)field;
      if (!no_free && *string_field)
        free (*string_field); /* free previous string */
      *string_field = gengetopt_strdup (val);
    }
    break;
  default:
    break;
  };

  /* check numeric conversion */
  switch(arg_type) {
  case ARG_INT:
  case ARG_DOUBLE:
    if (val && !(stop_char && *stop_char == '\0')) {
      fprintf(stderr, "%s: invalid numeric value: %s\n", package_name, val);
      return 1; /* failure */
    }
    break;
  default:
    ;
  };

  /* store the original value */
  switch(arg_type) {
  case ARG_NO:
  case ARG_FLAG:
    break;
  default:
    if (value && orig_field) {
      if (no_free) {
        *orig_field = value;
      } else {
        if (*orig_field)
          free (*orig_field); /* free previous string */
        *orig_field = gengetopt_strdup (value);
      }
    }
  };

  return 0; /* OK */
}